

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O0

void ParseScripts(void)

{
  hash_t hVar1;
  int iVar2;
  int local_10;
  int local_c;
  int lastlump;
  int lump;
  
  hVar1 = TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::CountUsed
                    (&TokenMap);
  if (hVar1 == 0) {
    InitTokenMap();
  }
  ZCC_InitOperators();
  ZCC_InitConversions();
  local_10 = 0;
  FScriptPosition::ResetErrorCounter();
  do {
    local_c = FWadCollection::FindLump(&Wads,"ZSCRIPT",&local_10,false);
    if (local_c == -1) {
      Printf("\x1cTWARNING!!!\n");
      Printf(
            "\x1cTAs of this version, Zscript is still considered a feature in development which can change \x1cGWITHOUT WARNING!!!\n"
            );
      Printf("\x1cTUse at your own risk!\n");
      return;
    }
    DoParse(local_c);
    iVar2 = DArgs::CheckParm(Args,"-zscript",1);
  } while (iVar2 != 0);
  return;
}

Assistant:

void ParseScripts()
{
	if (TokenMap.CountUsed() == 0)
	{
		InitTokenMap();
	}
	ZCC_InitOperators();
	ZCC_InitConversions();

	int lump, lastlump = 0;
	FScriptPosition::ResetErrorCounter();

	while ((lump = Wads.FindLump("ZSCRIPT", &lastlump)) != -1)
	{
		DoParse(lump);
		if (!Args->CheckParm("-zscript"))
		{
			return;
		}
	}
	Printf(TEXTCOLOR_PURPLE "WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "As of this version, Zscript is still considered a feature in development which can change " TEXTCOLOR_RED "WITHOUT WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "Use at your own risk!\n");

}